

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::PrepareBackgroundFindRoots(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  GuestArenaAllocator *pGVar4;
  Iterator local_40;
  
  if (this->hasPendingConcurrentFindRoot == false) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15c3,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar2) {
LAB_0068002a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->hasPendingConcurrentFindRoot = true;
  amd64_SAVE_REGISTERS(&this->savedThreadContext);
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::DisableResize(&this->pinnedObjectMap);
  local_40.list = &this->guestArenaList;
  local_40.current = &(local_40.list)->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
  do {
    if ((DListNode<Memory::Recycler::GuestArenaAllocator> *)local_40.current ==
        (DListNode<Memory::Recycler::GuestArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0068002a;
      *puVar3 = 0;
    }
    local_40.current =
         &((((DListNode<Memory::Recycler::GuestArenaAllocator> *)local_40.current)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.node)->
          super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
    if ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40.current ==
        local_40.list) {
      this->hasPendingDeleteGuestArena = false;
      return;
    }
    pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    (pGVar4->super_ArenaAllocator).
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
    lockBlockList = true;
    if (pGVar4->pendingDelete == true) {
      if (this->hasPendingDeleteGuestArena == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x15d9,"(this->hasPendingDeleteGuestArena)",
                           "this->hasPendingDeleteGuestArena");
        if (!bVar2) goto LAB_0068002a;
        *puVar3 = 0;
      }
      (pGVar4->super_ArenaAllocator).
      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
      lockBlockList = false;
      DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)&local_40,&HeapAllocator::Instance);
    }
    else if (this->backgroundFinishMarkCount == '\0') {
      ArenaData::UpdateCacheBlock
                (&(pGVar4->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_ArenaData);
    }
  } while( true );
}

Assistant:

void
Recycler::PrepareBackgroundFindRoots()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    this->hasPendingConcurrentFindRoot = true;

    // Save the thread context here. The background thread
    // will use this saved context for the marking instead of
    // trying to get the live thread context of the thread
    SAVE_THREAD_CONTEXT();

    // Temporarily disable resize so the background can scan without
    // the memory being freed from under it
    pinnedObjectMap.DisableResize();

    // Update the cached info for big blocks in the guest arena

    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        allocator.SetLockBlockList(true);

        if (allocator.pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
            allocator.SetLockBlockList(false);
            guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
        }
        else if (this->backgroundFinishMarkCount == 0)
        {
            // Update the cached info for big block
            allocator.GetBigBlocks(false);
        }
    }
    this->hasPendingDeleteGuestArena = false;
}